

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

long __thiscall
mkvparser::Cluster::ParseSimpleBlock(Cluster *this,longlong block_size,longlong *pos,long *len)

{
  IMkvReader *pReader;
  long lVar1;
  int iVar2;
  longlong lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uchar flags;
  longlong avail;
  longlong total;
  byte local_51;
  long local_50;
  long local_48;
  longlong local_40;
  undefined1 local_38 [8];
  
  lVar5 = *pos;
  pReader = this->m_pSegment->m_pReader;
  iVar2 = (*pReader->_vptr_IMkvReader[1])(pReader,local_38,&local_48);
  if (iVar2 < 0) {
    return (long)iVar2;
  }
  if (*pos < local_48) {
    local_50 = lVar5 + block_size;
    local_40 = block_size;
    lVar3 = GetUIntLength(pReader,*pos,len);
    if (lVar3 < 0) {
      return lVar3;
    }
    if (lVar3 != 0) {
      return -3;
    }
    lVar4 = *len + *pos;
    if (local_50 < lVar4) {
      return -2;
    }
    if (local_48 < lVar4) {
      return -3;
    }
    lVar3 = ReadUInt(pReader,*pos,len);
    if (lVar3 < 0) {
      return lVar3;
    }
    if (lVar3 == 0) {
      return -2;
    }
    lVar6 = *len;
    lVar1 = *pos;
    lVar4 = lVar1 + lVar6;
    *pos = lVar4;
    lVar6 = lVar1 + lVar6 + 2;
    if (local_50 < lVar6) {
      return -2;
    }
    if (local_48 < lVar6) {
      *len = 2;
      return -3;
    }
    *pos = lVar6;
    lVar4 = lVar4 + 3;
    if (local_50 < lVar4) {
      return -2;
    }
    if (lVar4 <= local_48) {
      iVar2 = (**pReader->_vptr_IMkvReader)(pReader,lVar6,1,&local_51);
      if (iVar2 < 0) {
        *len = 1;
        return (long)iVar2;
      }
      lVar4 = *pos + 1;
      *pos = lVar4;
      if (local_50 - lVar4 != 0 && lVar4 <= local_50) {
        if (((local_51 & 6) != 0) && (local_48 < local_50)) {
          *len = local_50 - lVar4;
          return -3;
        }
        lVar5 = CreateBlock(this,0xa3,lVar5,local_40,0);
        if (lVar5 == 0) {
          this->m_pos = local_50;
          return 0;
        }
        return lVar5;
      }
      return -2;
    }
  }
  *len = 1;
  return -3;
}

Assistant:

long Cluster::ParseSimpleBlock(long long block_size, long long& pos,
                               long& len) {
  const long long block_start = pos;
  const long long block_stop = pos + block_size;

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long total, avail;

  long status = pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  // parse track number

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  long long result = GetUIntLength(pReader, pos, len);

  if (result < 0)  // error
    return static_cast<long>(result);

  if (result > 0)  // weird
    return E_BUFFER_NOT_FULL;

  if ((pos + len) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + len) > avail)
    return E_BUFFER_NOT_FULL;

  const long long track = ReadUInt(pReader, pos, len);

  if (track < 0)  // error
    return static_cast<long>(track);

  if (track == 0)
    return E_FILE_FORMAT_INVALID;

  pos += len;  // consume track number

  if ((pos + 2) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + 2) > avail) {
    len = 2;
    return E_BUFFER_NOT_FULL;
  }

  pos += 2;  // consume timecode

  if ((pos + 1) > block_stop)
    return E_FILE_FORMAT_INVALID;

  if ((pos + 1) > avail) {
    len = 1;
    return E_BUFFER_NOT_FULL;
  }

  unsigned char flags;

  status = pReader->Read(pos, 1, &flags);

  if (status < 0) {  // error or underflow
    len = 1;
    return status;
  }

  ++pos;  // consume flags byte
  assert(pos <= avail);

  if (pos >= block_stop)
    return E_FILE_FORMAT_INVALID;

  const int lacing = int(flags & 0x06) >> 1;

  if ((lacing != 0) && (block_stop > avail)) {
    len = static_cast<long>(block_stop - pos);
    return E_BUFFER_NOT_FULL;
  }

  status = CreateBlock(libwebm::kMkvSimpleBlock, block_start, block_size,
                       0);  // DiscardPadding

  if (status != 0)
    return status;

  m_pos = block_stop;

  return 0;  // success
}